

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O1

void __thiscall CNetAddr::CNetAddr(CNetAddr *this,in_addr *ipv4Addr)

{
  long lVar1;
  CNetAddr *pCVar2;
  uint uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_addr)._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(this->m_addr)._union + 8) = 0;
  (this->m_addr)._size = 0;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::change_capacity(&this->m_addr,0x10);
  uVar3 = (this->m_addr)._size + 0x10;
  (this->m_addr)._size = uVar3;
  pCVar2 = this;
  if (0x10 < uVar3) {
    pCVar2 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
  }
  (pCVar2->m_addr)._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(pCVar2->m_addr)._union + 8) = 0;
  this->m_net = NET_IPV4;
  this->m_scope_id = 0;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::assign<const_unsigned_char_*>
            (&this->m_addr,(uchar *)ipv4Addr,(uchar *)(ipv4Addr + 1));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CNetAddr::CNetAddr(const struct in_addr& ipv4Addr)
{
    m_net = NET_IPV4;
    const uint8_t* ptr = reinterpret_cast<const uint8_t*>(&ipv4Addr);
    m_addr.assign(ptr, ptr + ADDR_IPV4_SIZE);
}